

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O3

void __thiscall TPZAcademicGeoMesh::DeformGMesh(TPZAcademicGeoMesh *this,TPZGeoMesh *gmesh)

{
  long lVar1;
  TPZGeoNode *pTVar2;
  TPZGeoEl **ppTVar3;
  int i;
  long lVar4;
  long nelem;
  TPZManVector<double,_3> xbefore;
  TPZManVector<double,_3> xafter;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  lVar1 = (gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
  TPZManVector<double,_3>::TPZManVector(&local_a0,3);
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  if (0 < lVar1) {
    nelem = 0;
    do {
      pTVar2 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
      TPZGeoNode::GetCoordinates(pTVar2,&local_a0.super_TPZVec<double>);
      lVar4 = 0;
      do {
        local_a0.super_TPZVec<double>.fStore[lVar4] =
             local_a0.super_TPZVec<double>.fStore[lVar4] +
             local_a0.super_TPZVec<double>.fStore[lVar4] + -1.0;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(this->fDeformed).fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>,0);
      (**(code **)(*(long *)*ppTVar3 + 0x228))(*ppTVar3,&local_a0,&local_68);
      pTVar2 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
      TPZGeoNode::SetCoord(pTVar2,&local_68.super_TPZVec<double>);
      nelem = nelem + 1;
    } while (nelem != lVar1);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  TPZManVector<double,_3>::~TPZManVector(&local_a0);
  return;
}

Assistant:

void TPZAcademicGeoMesh::DeformGMesh(TPZGeoMesh &gmesh)
{
    int64_t nnodes = gmesh.NodeVec().NElements();
    TPZManVector<REAL,3> xbefore(3),xafter(3);
    for (int64_t nod=0; nod<nnodes; nod++) {
        gmesh.NodeVec()[nod].GetCoordinates(xbefore);
        for (int i=0; i<3; i++) {
            xbefore[i] = 2.*xbefore[i]-1.;
        }
        fDeformed.ElementVec()[0]->X(xbefore, xafter);
        gmesh.NodeVec()[nod].SetCoord(xafter);
    }
}